

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O2

void __thiscall Clasp::mt::ParallelHandler::handleSplitMessage(ParallelHandler *this)

{
  Solver *this_00;
  bool bVar1;
  undefined8 *puVar2;
  LitVec *out;
  SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
  newPath;
  
  this_00 = this->solver_;
  puVar2 = (undefined8 *)operator_new(0x10);
  *puVar2 = 0;
  puVar2[1] = 0;
  newPath.ptr_ = (ulong)puVar2 | 1;
  out = (LitVec *)((ulong)puVar2 & 0xfffffffffffffffe);
  bVar1 = Solver::split(this_00,out);
  if (bVar1) {
    newPath.ptr_ = (uintp)out;
    ParallelSolve::pushWork(this->ctrl_,out);
    SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::~SingleOwnerPtr(&newPath);
    return;
  }
  Potassco::fail(-1,"void Clasp::mt::ParallelHandler::handleSplitMessage()",0x34c,"ok",
                 "unexpected call to split",0);
}

Assistant:

void ParallelHandler::handleSplitMessage() {
	assert(solver_ && "ParallelHandler::handleSplitMessage(): not attached!");
	Solver& s = *solver_;
	SingleOwnerPtr<LitVec> newPath(new LitVec());
	bool ok = s.split(*newPath);
	POTASSCO_ASSERT(ok, "unexpected call to split");
	ctrl_->pushWork(newPath.release());
}